

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O3

var * __thiscall cs::domain_manager::get_var(domain_manager *this,var_id *id)

{
  stack_pointer psVar1;
  domain_type *pdVar2;
  size_t sVar3;
  ulong uVar4;
  runtime_error *this_00;
  long *plVar5;
  var *pvVar6;
  size_type *psVar7;
  domain_type *pdVar8;
  ulong uVar9;
  long lVar10;
  size_t domain_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  psVar1 = *this->fiber_stack;
  uVar4 = id->m_domain_id;
  if (psVar1 != (stack_pointer)0x0) {
    pdVar8 = psVar1->m_current;
    uVar9 = ((long)pdVar8 - (long)psVar1->m_start >> 5) * -0x5555555555555555;
    if ((uVar4 < uVar9) &&
       ((id->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        pdVar8[-1 - uVar4].m_ref.super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)) {
      pdVar8 = pdVar8 + -uVar4;
      goto LAB_001690bf;
    }
    if (pdVar8 != psVar1->m_start) {
      lVar10 = -0x60;
      domain_id = 0;
      do {
        sVar3 = phmap::priv::
                raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                ::count<std::__cxx11::string>
                          ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                            *)((long)&((*this->fiber_stack)->m_current->m_reflect).
                                      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                      .
                                      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                      .ctrl_ + lVar10),&id->m_id);
        if (sVar3 != 0) {
          pdVar8 = (domain_type *)
                   ((long)&((*this->fiber_stack)->m_current->m_reflect).
                           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           .
                           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           .ctrl_ + lVar10);
          goto LAB_0016909e;
        }
        domain_id = domain_id + 1;
        lVar10 = lVar10 + -0x60;
      } while (uVar9 + (uVar9 == 0) != domain_id);
      uVar4 = id->m_domain_id;
    }
  }
  pdVar2 = (this->m_data).m_start;
  pdVar8 = (this->m_data).m_current;
  uVar9 = ((long)pdVar8 - (long)pdVar2 >> 5) * -0x5555555555555555;
  if ((uVar9 <= uVar4) ||
     ((id->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      pdVar8[-1 - uVar4].m_ref.super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     )) {
    if (pdVar8 != pdVar2) {
      lVar10 = -0x60;
      domain_id = 0;
      do {
        sVar3 = phmap::priv::
                raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                ::count<std::__cxx11::string>
                          ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                            *)((long)&(((this->m_data).m_current)->m_reflect).
                                      super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                      .
                                      super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                      .ctrl_ + lVar10),&id->m_id);
        if (sVar3 != 0) {
          pdVar8 = (domain_type *)
                   ((long)&(((this->m_data).m_current)->m_reflect).
                           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           .
                           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           .ctrl_ + lVar10);
LAB_0016909e:
          pvVar6 = domain_type::get_var_no_check(pdVar8,id,domain_id);
          return pvVar6;
        }
        domain_id = domain_id + 1;
        lVar10 = lVar10 + -0x60;
      } while (uVar9 + (uVar9 == 0) != domain_id);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::operator+(&local_70,"Use of undefined variable \"",&id->m_id);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_50._M_dataplus._M_p = (pointer)*plVar5;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_50._M_dataplus._M_p == psVar7) {
      local_50.field_2._M_allocated_capacity = *psVar7;
      local_50.field_2._8_8_ = plVar5[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar7;
    }
    local_50._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    runtime_error::runtime_error(this_00,&local_50);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  pdVar8 = pdVar8 + -uVar4;
LAB_001690bf:
  return pdVar8[-1].m_slot.super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
         super__Vector_impl_data._M_start + id->m_slot_id;
}

Assistant:

inline var &get_var(const var_id &id)
		{
			if (fiber_stack != nullptr) {
				if (id.m_domain_id < fiber_stack->size() && (*fiber_stack)[id.m_domain_id].consistence(id))
					return (*fiber_stack)[id.m_domain_id].get_var_by_id(id.m_slot_id);
				for (std::size_t i = 0, size = fiber_stack->size(); i < size; ++i)
					if ((*fiber_stack)[i].exist(id))
						return (*fiber_stack)[i].get_var_no_check(id, i);
			}
			if (id.m_domain_id < m_data.size() && m_data[id.m_domain_id].consistence(id))
				return m_data[id.m_domain_id].get_var_by_id(id.m_slot_id);
			for (std::size_t i = 0, size = m_data.size(); i < size; ++i)
				if (m_data[i].exist(id))
					return m_data[i].get_var_no_check(id, i);
			throw runtime_error("Use of undefined variable \"" + id.get_id() + "\".");
		}